

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O2

void __thiscall
Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>::Field
          (Field<Fixpp::TagT<276U,_Fixpp::Type::String>_> *this,
          Field<Fixpp::TagT<276U,_Fixpp::Type::String>_> *other)

{
  (this->val_)._M_dataplus._M_p = (pointer)&(this->val_).field_2;
  (this->val_)._M_string_length = 0;
  (this->val_).field_2._M_local_buf[0] = '\0';
  this->empty_ = false;
  operator=(this,other);
  return;
}

Assistant:

Field(const Field& other)
        {
            operator=(other);
        }